

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_impl.h
# Opt level: O3

void __thiscall
node::Node<label::StringLabel>::Node(Node<label::StringLabel> *this,ConstReference label)

{
  pointer pcVar1;
  
  (this->children_).
  super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children_).
  super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children_).
  super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->label_).label_._M_dataplus._M_p = (pointer)&(this->label_).label_.field_2;
  pcVar1 = (label->label_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->label_,pcVar1,pcVar1 + (label->label_)._M_string_length);
  return;
}

Assistant:

Node<Label>::Node(ConstReference label) : label_(label) {}